

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  uchar uVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  undefined8 uVar5;
  stbi_uc sVar6;
  byte bVar7;
  stbi_uc sVar8;
  char cVar9;
  stbi__uint16 sVar10;
  stbi__uint32 sVar11;
  int iVar12;
  int iVar13;
  stbi__uint32 sVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  void *pvVar20;
  stbi__context *data;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar21;
  uchar *puVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  stbi__uint32 sVar32;
  stbi__uint16 *psVar33;
  stbi__uint16 *psVar34;
  long in_FS_OFFSET;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar112 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  int iVar145;
  int iVar149;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  stbi_uc pal [256] [4];
  stbi__uint16 *local_8980;
  int local_8958;
  uint local_8944;
  uint local_892c;
  stbi__uint16 *local_8920;
  stbi__uint16 *local_8918;
  uint local_8908;
  uint local_88f8;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  psVar21 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  lVar27 = 0;
  ri_00 = ri;
  do {
    sVar6 = stbi__get8(s);
    if (sVar6 != (&stbi__check_png_header_png_sig)[lVar27]) {
      *(char **)(in_FS_OFFSET + -0x20) = "bad png sig";
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      sVar6 = stbi__get8(s);
      if ((sVar6 != 'B') || (sVar6 = stbi__get8(s), sVar6 != 'M')) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_0010729d:
        iVar12 = stbi__gif_test(s);
        if (iVar12 != 0) {
          memset(&local_88a8,0,0x8870);
          data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar21);
          if (data == (stbi__context *)0x0 || data == s) {
            if (local_88a8.out != (stbi_uc *)0x0) {
              free(local_88a8.out);
            }
            data = (stbi__context *)0x0;
          }
          else {
            *x = local_88a8.w;
            *y = local_88a8.h;
            if ((req_comp & 0xfffffffbU) != 0) {
              data = (stbi__context *)
                     stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
            }
          }
          free(local_88a8.history);
          local_88a8.out = local_88a8.background;
          goto LAB_00107595;
        }
        sVar11 = stbi__get32be(s);
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (sVar11 != 0x38425053) {
          iVar12 = stbi__pic_test(s);
          if (iVar12 != 0) {
            pvVar20 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
            return pvVar20;
          }
          iVar12 = stbi__jpeg_test(s);
          if (iVar12 != 0) {
            pvVar20 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
            return pvVar20;
          }
          iVar12 = stbi__pnm_test(s);
          if (iVar12 != 0) {
            pvVar20 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
            return pvVar20;
          }
          iVar12 = stbi__hdr_test(s);
          if (iVar12 != 0) {
            data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
            if (req_comp == 0) {
              req_comp = *comp;
            }
            psVar21 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
            return psVar21;
          }
          iVar12 = stbi__tga_test(s);
          if (iVar12 != 0) {
            pvVar20 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
            return pvVar20;
          }
          pcVar19 = "unknown image type";
          goto LAB_00107785;
        }
        sVar11 = stbi__get32be(s);
        if (sVar11 != 0x38425053) {
          pcVar19 = "not PSD";
          goto LAB_00107785;
        }
        sVar6 = stbi__get8(s);
        sVar8 = stbi__get8(s);
        if (CONCAT11(sVar6,sVar8) != 1) {
          pcVar19 = "wrong version";
          goto LAB_00107785;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar21 = s->img_buffer;
LAB_00107719:
          s->img_buffer = psVar21 + 6;
        }
        else {
          psVar21 = s->img_buffer;
          iVar12 = (int)s->img_buffer_end - (int)psVar21;
          if (5 < iVar12) goto LAB_00107719;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,6 - iVar12);
        }
        sVar6 = stbi__get8(s);
        bVar7 = stbi__get8(s);
        uVar29 = (uint)CONCAT11(sVar6,bVar7);
        if (0x10 < uVar29) {
          pcVar19 = "wrong channel count";
          goto LAB_00107785;
        }
        sVar11 = stbi__get32be(s);
        sVar14 = stbi__get32be(s);
        if ((0x1000000 < (int)sVar11) || (0x1000000 < (int)sVar14)) goto LAB_0010777e;
        sVar6 = stbi__get8(s);
        sVar8 = stbi__get8(s);
        sVar3 = CONCAT11(sVar6,sVar8);
        if ((sVar3 != 8) && (sVar3 != 0x10)) {
          pcVar19 = "unsupported bit depth";
          goto LAB_00107785;
        }
        sVar6 = stbi__get8(s);
        sVar8 = stbi__get8(s);
        if (CONCAT11(sVar6,sVar8) != 3) {
          pcVar19 = "wrong color format";
          goto LAB_00107785;
        }
        sVar32 = stbi__get32be(s);
        stbi__skip(s,sVar32);
        sVar32 = stbi__get32be(s);
        stbi__skip(s,sVar32);
        sVar32 = stbi__get32be(s);
        stbi__skip(s,sVar32);
        uVar16 = stbi__get16be(s);
        if (1 < uVar16) {
          pcVar19 = "bad compression";
          goto LAB_00107785;
        }
        iVar12 = stbi__mad3sizes_valid(4,sVar14,sVar11,0);
        if (iVar12 == 0) goto LAB_0010777e;
        if (((bpc == 0x10) && (sVar3 == 0x10)) && (uVar16 == 0)) {
          local_8980 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar14,sVar11,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          local_8980 = (stbi__uint16 *)malloc((long)(int)(sVar11 * sVar14 * 4));
        }
        if (local_8980 == (stbi__uint16 *)0x0) {
LAB_00108cfc:
          pcVar19 = "outofmem";
          goto LAB_00107785;
        }
        uVar24 = sVar14 * sVar11;
        uVar25 = (ulong)uVar24;
        if (uVar16 == 0) {
          lVar27 = uVar25 - 1;
          auVar39._8_4_ = (int)lVar27;
          auVar39._0_8_ = lVar27;
          auVar39._12_4_ = (int)((ulong)lVar27 >> 0x20);
          psVar34 = local_8980 + 0x1e;
          psVar33 = local_8980 + 0x1c;
          uVar31 = 0;
          auVar119._8_4_ = 0xffffffff;
          auVar119._0_8_ = 0xffffffffffffffff;
          auVar119._12_4_ = 0xffffffff;
          auVar112 = _DAT_00115520;
          local_8920 = local_8980;
          local_8918 = local_8980;
          do {
            if (uVar31 < uVar29) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < (int)uVar24) {
                  lVar27 = 0;
                  do {
                    sVar6 = stbi__get8(s);
                    sVar8 = stbi__get8(s);
                    auVar112 = _DAT_00115520;
                    auVar119._8_4_ = 0xffffffff;
                    auVar119._0_8_ = 0xffffffffffffffff;
                    auVar119._12_4_ = 0xffffffff;
                    local_8918[lVar27 * 4] = CONCAT11(sVar6,sVar8);
                    lVar27 = lVar27 + 1;
                  } while (uVar24 != (uint)lVar27);
                }
              }
              else if (sVar3 == 0x10) {
                if (0 < (int)uVar24) {
                  lVar27 = 0;
                  do {
                    sVar6 = stbi__get8(s);
                    stbi__get8(s);
                    auVar112 = _DAT_00115520;
                    auVar119._8_4_ = 0xffffffff;
                    auVar119._0_8_ = 0xffffffffffffffff;
                    auVar119._12_4_ = 0xffffffff;
                    *(stbi_uc *)(local_8920 + lVar27 * 2) = sVar6;
                    lVar27 = lVar27 + 1;
                  } while (uVar24 != (uint)lVar27);
                }
              }
              else if (0 < (int)uVar24) {
                lVar27 = 0;
                do {
                  sVar6 = stbi__get8(s);
                  auVar112 = _DAT_00115520;
                  auVar119._8_4_ = 0xffffffff;
                  auVar119._0_8_ = 0xffffffffffffffff;
                  auVar119._12_4_ = 0xffffffff;
                  *(stbi_uc *)(local_8920 + lVar27 * 2) = sVar6;
                  lVar27 = lVar27 + 1;
                } while (uVar24 != (uint)lVar27);
              }
            }
            else if (sVar3 == 0x10 && bpc == 0x10) {
              if (0 < (int)uVar24) {
                sVar10 = -(ushort)(uVar31 == 3);
                uVar28 = 0;
                do {
                  auVar40._8_4_ = (int)uVar28;
                  auVar40._0_8_ = uVar28;
                  auVar40._12_4_ = (int)(uVar28 >> 0x20);
                  auVar48 = auVar39 ^ auVar112;
                  auVar70 = (auVar40 | _DAT_00115510) ^ auVar112;
                  iVar12 = auVar48._0_4_;
                  iVar15 = -(uint)(iVar12 < auVar70._0_4_);
                  iVar13 = auVar48._4_4_;
                  auVar72._4_4_ = -(uint)(iVar13 < auVar70._4_4_);
                  iVar26 = auVar48._8_4_;
                  iVar145 = -(uint)(iVar26 < auVar70._8_4_);
                  iVar23 = auVar48._12_4_;
                  auVar72._12_4_ = -(uint)(iVar23 < auVar70._12_4_);
                  auVar96._4_4_ = iVar15;
                  auVar96._0_4_ = iVar15;
                  auVar96._8_4_ = iVar145;
                  auVar96._12_4_ = iVar145;
                  auVar48 = pshuflw(in_XMM5,auVar96,0xe8);
                  auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar13);
                  auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar23);
                  auVar71._0_4_ = auVar71._4_4_;
                  auVar71._8_4_ = auVar71._12_4_;
                  auVar117 = pshuflw(in_XMM6,auVar71,0xe8);
                  auVar72._0_4_ = auVar72._4_4_;
                  auVar72._8_4_ = auVar72._12_4_;
                  auVar70 = pshuflw(auVar48,auVar72,0xe8);
                  auVar70 = (auVar70 | auVar117 & auVar48) ^ auVar119;
                  auVar70 = packssdw(auVar70,auVar70);
                  if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4 + 0xffffffffffffffe4] = sVar10;
                  }
                  auVar72 = auVar71 & auVar96 | auVar72;
                  auVar70 = packssdw(auVar72,auVar72);
                  auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                  if ((auVar70._0_4_ >> 0x10 & 1) != 0) {
                    psVar33[uVar28 * 4 + 0xffffffffffffffe8] = sVar10;
                  }
                  auVar70 = (auVar40 | _DAT_00115500) ^ auVar112;
                  iVar15 = -(uint)(iVar12 < auVar70._0_4_);
                  auVar109._4_4_ = -(uint)(iVar13 < auVar70._4_4_);
                  iVar145 = -(uint)(iVar26 < auVar70._8_4_);
                  auVar109._12_4_ = -(uint)(iVar23 < auVar70._12_4_);
                  auVar73._4_4_ = iVar15;
                  auVar73._0_4_ = iVar15;
                  auVar73._8_4_ = iVar145;
                  auVar73._12_4_ = iVar145;
                  auVar97._4_4_ = -(uint)(auVar70._4_4_ == iVar13);
                  auVar97._12_4_ = -(uint)(auVar70._12_4_ == iVar23);
                  auVar97._0_4_ = auVar97._4_4_;
                  auVar97._8_4_ = auVar97._12_4_;
                  auVar109._0_4_ = auVar109._4_4_;
                  auVar109._8_4_ = auVar109._12_4_;
                  auVar70 = auVar97 & auVar73 | auVar109;
                  auVar70 = packssdw(auVar70,auVar70);
                  auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                  if ((auVar70 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4 + 0xffffffffffffffec] = sVar10;
                  }
                  auVar74 = pshufhw(auVar73,auVar73,0x84);
                  auVar125 = pshufhw(auVar97,auVar97,0x84);
                  auVar123 = pshufhw(auVar74,auVar109,0x84);
                  auVar74 = (auVar123 | auVar125 & auVar74) ^ auVar119;
                  auVar74 = packssdw(auVar74,auVar74);
                  if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4 + 0xfffffffffffffff0] = sVar10;
                  }
                  auVar74 = (auVar40 | _DAT_001154f0) ^ auVar112;
                  iVar15 = -(uint)(iVar12 < auVar74._0_4_);
                  auVar76._4_4_ = -(uint)(iVar13 < auVar74._4_4_);
                  iVar145 = -(uint)(iVar26 < auVar74._8_4_);
                  auVar76._12_4_ = -(uint)(iVar23 < auVar74._12_4_);
                  auVar98._4_4_ = iVar15;
                  auVar98._0_4_ = iVar15;
                  auVar98._8_4_ = iVar145;
                  auVar98._12_4_ = iVar145;
                  auVar70 = pshuflw(auVar70,auVar98,0xe8);
                  auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar13);
                  auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar23);
                  auVar75._0_4_ = auVar75._4_4_;
                  auVar75._8_4_ = auVar75._12_4_;
                  in_XMM6 = pshuflw(auVar117 & auVar48,auVar75,0xe8);
                  in_XMM6 = in_XMM6 & auVar70;
                  auVar76._0_4_ = auVar76._4_4_;
                  auVar76._8_4_ = auVar76._12_4_;
                  auVar48 = pshuflw(auVar70,auVar76,0xe8);
                  auVar48 = (auVar48 | in_XMM6) ^ auVar119;
                  in_XMM5 = packssdw(auVar48,auVar48);
                  if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4 + 0xfffffffffffffff4] = sVar10;
                  }
                  auVar76 = auVar75 & auVar98 | auVar76;
                  auVar48 = packssdw(auVar76,auVar76);
                  auVar48 = packssdw(auVar48 ^ auVar119,auVar48 ^ auVar119);
                  if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4 + 0xfffffffffffffff8] = sVar10;
                  }
                  auVar48 = (auVar40 | _DAT_001154e0) ^ auVar112;
                  auVar99._0_4_ = -(uint)(iVar12 < auVar48._0_4_);
                  auVar99._4_4_ = -(uint)(iVar13 < auVar48._4_4_);
                  auVar99._8_4_ = -(uint)(iVar26 < auVar48._8_4_);
                  auVar99._12_4_ = -(uint)(iVar23 < auVar48._12_4_);
                  auVar77._4_4_ = auVar99._0_4_;
                  auVar77._0_4_ = auVar99._0_4_;
                  auVar77._8_4_ = auVar99._8_4_;
                  auVar77._12_4_ = auVar99._8_4_;
                  auVar41._4_4_ = -(uint)(auVar48._4_4_ == iVar13);
                  auVar41._12_4_ = -(uint)(auVar48._12_4_ == iVar23);
                  auVar41._0_4_ = auVar41._4_4_;
                  auVar41._8_4_ = auVar41._12_4_;
                  auVar49._4_4_ = auVar99._4_4_;
                  auVar49._0_4_ = auVar99._4_4_;
                  auVar49._8_4_ = auVar99._12_4_;
                  auVar49._12_4_ = auVar99._12_4_;
                  auVar48 = packssdw(auVar99,auVar41 & auVar77 | auVar49);
                  auVar48 = packssdw(auVar48 ^ auVar119,auVar48 ^ auVar119);
                  if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4 + 0xfffffffffffffffc] = sVar10;
                  }
                  auVar117 = pshufhw(auVar77,auVar77,0x84);
                  auVar48 = pshufhw(auVar41,auVar41,0x84);
                  auVar70 = pshufhw(auVar49,auVar49,0x84);
                  auVar48 = packssdw(auVar48 & auVar117,(auVar70 | auVar48 & auVar117) ^ auVar119);
                  if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    psVar33[uVar28 * 4] = sVar10;
                  }
                  uVar28 = uVar28 + 8;
                } while ((uVar24 + 7 & 0xfffffff8) != uVar28);
              }
            }
            else if (0 < (int)uVar24) {
              cVar9 = -(uVar31 == 3);
              uVar28 = 0;
              do {
                auVar48._8_4_ = (int)uVar28;
                auVar48._0_8_ = uVar28;
                auVar48._12_4_ = (int)(uVar28 >> 0x20);
                auVar70 = auVar39 ^ auVar112;
                auVar117 = (auVar48 | _DAT_00115510) ^ auVar112;
                iVar12 = auVar70._0_4_;
                iVar15 = -(uint)(iVar12 < auVar117._0_4_);
                iVar13 = auVar70._4_4_;
                auVar74._4_4_ = -(uint)(iVar13 < auVar117._4_4_);
                iVar26 = auVar70._8_4_;
                iVar145 = -(uint)(iVar26 < auVar117._8_4_);
                iVar23 = auVar70._12_4_;
                auVar74._12_4_ = -(uint)(iVar23 < auVar117._12_4_);
                auVar123._4_4_ = iVar15;
                auVar123._0_4_ = iVar15;
                auVar123._8_4_ = iVar145;
                auVar123._12_4_ = iVar145;
                auVar125 = pshuflw(in_XMM5,auVar123,0xe8);
                auVar70._4_4_ = -(uint)(auVar117._4_4_ == iVar13);
                auVar70._12_4_ = -(uint)(auVar117._12_4_ == iVar23);
                auVar70._0_4_ = auVar70._4_4_;
                auVar70._8_4_ = auVar70._12_4_;
                auVar51 = pshuflw(in_XMM6,auVar70,0xe8);
                auVar74._0_4_ = auVar74._4_4_;
                auVar74._8_4_ = auVar74._12_4_;
                auVar117 = pshuflw(auVar125,auVar74,0xe8);
                auVar117 = (auVar117 | auVar51 & auVar125) ^ auVar119;
                auVar117 = packssdw(auVar117,auVar117);
                if ((auVar117 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffe2) = cVar9;
                }
                auVar74 = auVar70 & auVar123 | auVar74;
                auVar70 = packssdw(auVar74,auVar74);
                auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                auVar70 = packsswb(auVar70,auVar70);
                if ((auVar70._0_4_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffe4) = cVar9;
                }
                auVar70 = (auVar48 | _DAT_00115500) ^ auVar112;
                iVar15 = -(uint)(iVar12 < auVar70._0_4_);
                auVar89._4_4_ = -(uint)(iVar13 < auVar70._4_4_);
                iVar145 = -(uint)(iVar26 < auVar70._8_4_);
                auVar89._12_4_ = -(uint)(iVar23 < auVar70._12_4_);
                auVar117._4_4_ = iVar15;
                auVar117._0_4_ = iVar15;
                auVar117._8_4_ = iVar145;
                auVar117._12_4_ = iVar145;
                auVar113._4_4_ = -(uint)(auVar70._4_4_ == iVar13);
                auVar113._12_4_ = -(uint)(auVar70._12_4_ == iVar23);
                auVar113._0_4_ = auVar113._4_4_;
                auVar113._8_4_ = auVar113._12_4_;
                auVar89._0_4_ = auVar89._4_4_;
                auVar89._8_4_ = auVar89._12_4_;
                auVar70 = auVar113 & auVar117 | auVar89;
                auVar70 = packssdw(auVar70,auVar70);
                auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                auVar70 = packsswb(auVar70,auVar70);
                if ((auVar70._0_4_ >> 0x10 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffe6) = cVar9;
                }
                auVar117 = pshufhw(auVar117,auVar117,0x84);
                auVar123 = pshufhw(auVar113,auVar113,0x84);
                auVar74 = pshufhw(auVar117,auVar89,0x84);
                auVar117 = (auVar74 | auVar123 & auVar117) ^ auVar119;
                auVar117 = packssdw(auVar117,auVar117);
                auVar117 = packsswb(auVar117,auVar117);
                if ((auVar117._0_4_ >> 0x18 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffe8) = cVar9;
                }
                auVar117 = (auVar48 | _DAT_001154f0) ^ auVar112;
                iVar15 = -(uint)(iVar12 < auVar117._0_4_);
                auVar79._4_4_ = -(uint)(iVar13 < auVar117._4_4_);
                iVar145 = -(uint)(iVar26 < auVar117._8_4_);
                auVar79._12_4_ = -(uint)(iVar23 < auVar117._12_4_);
                auVar100._4_4_ = iVar15;
                auVar100._0_4_ = iVar15;
                auVar100._8_4_ = iVar145;
                auVar100._12_4_ = iVar145;
                auVar70 = pshuflw(auVar70,auVar100,0xe8);
                auVar78._4_4_ = -(uint)(auVar117._4_4_ == iVar13);
                auVar78._12_4_ = -(uint)(auVar117._12_4_ == iVar23);
                auVar78._0_4_ = auVar78._4_4_;
                auVar78._8_4_ = auVar78._12_4_;
                auVar74 = pshuflw(auVar51 & auVar125,auVar78,0xe8);
                auVar79._0_4_ = auVar79._4_4_;
                auVar79._8_4_ = auVar79._12_4_;
                auVar117 = pshuflw(auVar70,auVar79,0xe8);
                auVar117 = (auVar117 | auVar74 & auVar70) ^ auVar119;
                auVar117 = packssdw(auVar117,auVar117);
                auVar117 = packsswb(auVar117,auVar117);
                if ((auVar117 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffea) = cVar9;
                }
                auVar79 = auVar78 & auVar100 | auVar79;
                auVar117 = packssdw(auVar79,auVar79);
                auVar117 = packssdw(auVar117 ^ auVar119,auVar117 ^ auVar119);
                auVar117 = packsswb(auVar117,auVar117);
                if ((auVar117._4_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffec) = cVar9;
                }
                auVar117 = (auVar48 | _DAT_001154e0) ^ auVar112;
                iVar15 = -(uint)(iVar12 < auVar117._0_4_);
                auVar110._4_4_ = -(uint)(iVar13 < auVar117._4_4_);
                iVar145 = -(uint)(iVar26 < auVar117._8_4_);
                auVar110._12_4_ = -(uint)(iVar23 < auVar117._12_4_);
                auVar125._4_4_ = iVar15;
                auVar125._0_4_ = iVar15;
                auVar125._8_4_ = iVar145;
                auVar125._12_4_ = iVar145;
                auVar51._4_4_ = -(uint)(auVar117._4_4_ == iVar13);
                auVar51._12_4_ = -(uint)(auVar117._12_4_ == iVar23);
                auVar51._0_4_ = auVar51._4_4_;
                auVar51._8_4_ = auVar51._12_4_;
                auVar110._0_4_ = auVar110._4_4_;
                auVar110._8_4_ = auVar110._12_4_;
                auVar117 = auVar51 & auVar125 | auVar110;
                auVar117 = packssdw(auVar117,auVar117);
                auVar117 = packssdw(auVar117 ^ auVar119,auVar117 ^ auVar119);
                auVar117 = packsswb(auVar117,auVar117);
                if ((auVar117 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xffffffffffffffee) = cVar9;
                }
                auVar123 = pshufhw(auVar125,auVar125,0x84);
                auVar51 = pshufhw(auVar51,auVar51,0x84);
                auVar125 = pshufhw(auVar123,auVar110,0x84);
                auVar123 = (auVar125 | auVar51 & auVar123) ^ auVar119;
                auVar123 = packssdw(auVar123,auVar123);
                auVar123 = packsswb(auVar123,auVar123);
                if ((auVar123._6_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffff0) = cVar9;
                }
                auVar123 = (auVar48 | _DAT_001154d0) ^ auVar112;
                iVar15 = -(uint)(iVar12 < auVar123._0_4_);
                auVar81._4_4_ = -(uint)(iVar13 < auVar123._4_4_);
                iVar145 = -(uint)(iVar26 < auVar123._8_4_);
                auVar81._12_4_ = -(uint)(iVar23 < auVar123._12_4_);
                auVar101._4_4_ = iVar15;
                auVar101._0_4_ = iVar15;
                auVar101._8_4_ = iVar145;
                auVar101._12_4_ = iVar145;
                auVar117 = pshuflw(auVar117,auVar101,0xe8);
                auVar80._4_4_ = -(uint)(auVar123._4_4_ == iVar13);
                auVar80._12_4_ = -(uint)(auVar123._12_4_ == iVar23);
                auVar80._0_4_ = auVar80._4_4_;
                auVar80._8_4_ = auVar80._12_4_;
                auVar74 = pshuflw(auVar74 & auVar70,auVar80,0xe8);
                auVar81._0_4_ = auVar81._4_4_;
                auVar81._8_4_ = auVar81._12_4_;
                auVar70 = pshuflw(auVar117,auVar81,0xe8);
                auVar70 = (auVar70 | auVar74 & auVar117) ^ auVar119;
                auVar70 = packssdw(auVar70,auVar70);
                auVar70 = packsswb(auVar70,auVar70);
                if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffff2) = cVar9;
                }
                auVar81 = auVar80 & auVar101 | auVar81;
                auVar70 = packssdw(auVar81,auVar81);
                auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                auVar70 = packsswb(auVar70,auVar70);
                if ((auVar70._8_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffff4) = cVar9;
                }
                auVar70 = (auVar48 | _DAT_001154c0) ^ auVar112;
                iVar15 = -(uint)(iVar12 < auVar70._0_4_);
                auVar111._4_4_ = -(uint)(iVar13 < auVar70._4_4_);
                iVar145 = -(uint)(iVar26 < auVar70._8_4_);
                auVar111._12_4_ = -(uint)(iVar23 < auVar70._12_4_);
                auVar82._4_4_ = iVar15;
                auVar82._0_4_ = iVar15;
                auVar82._8_4_ = iVar145;
                auVar82._12_4_ = iVar145;
                auVar102._4_4_ = -(uint)(auVar70._4_4_ == iVar13);
                auVar102._12_4_ = -(uint)(auVar70._12_4_ == iVar23);
                auVar102._0_4_ = auVar102._4_4_;
                auVar102._8_4_ = auVar102._12_4_;
                auVar111._0_4_ = auVar111._4_4_;
                auVar111._8_4_ = auVar111._12_4_;
                auVar70 = auVar102 & auVar82 | auVar111;
                auVar70 = packssdw(auVar70,auVar70);
                auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                auVar70 = packsswb(auVar70,auVar70);
                if ((auVar70 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffff6) = cVar9;
                }
                auVar123 = pshufhw(auVar82,auVar82,0x84);
                auVar51 = pshufhw(auVar102,auVar102,0x84);
                auVar125 = pshufhw(auVar123,auVar111,0x84);
                auVar123 = (auVar125 | auVar51 & auVar123) ^ auVar119;
                auVar123 = packssdw(auVar123,auVar123);
                auVar123 = packsswb(auVar123,auVar123);
                if ((auVar123._10_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffff8) = cVar9;
                }
                auVar123 = (auVar48 | _DAT_001154b0) ^ auVar112;
                iVar15 = -(uint)(iVar12 < auVar123._0_4_);
                auVar84._4_4_ = -(uint)(iVar13 < auVar123._4_4_);
                iVar145 = -(uint)(iVar26 < auVar123._8_4_);
                auVar84._12_4_ = -(uint)(iVar23 < auVar123._12_4_);
                auVar103._4_4_ = iVar15;
                auVar103._0_4_ = iVar15;
                auVar103._8_4_ = iVar145;
                auVar103._12_4_ = iVar145;
                auVar70 = pshuflw(auVar70,auVar103,0xe8);
                auVar83._4_4_ = -(uint)(auVar123._4_4_ == iVar13);
                auVar83._12_4_ = -(uint)(auVar123._12_4_ == iVar23);
                auVar83._0_4_ = auVar83._4_4_;
                auVar83._8_4_ = auVar83._12_4_;
                in_XMM6 = pshuflw(auVar74 & auVar117,auVar83,0xe8);
                in_XMM6 = in_XMM6 & auVar70;
                auVar84._0_4_ = auVar84._4_4_;
                auVar84._8_4_ = auVar84._12_4_;
                auVar70 = pshuflw(auVar70,auVar84,0xe8);
                auVar70 = (auVar70 | in_XMM6) ^ auVar119;
                auVar70 = packssdw(auVar70,auVar70);
                in_XMM5 = packsswb(auVar70,auVar70);
                if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffffa) = cVar9;
                }
                auVar84 = auVar83 & auVar103 | auVar84;
                auVar70 = packssdw(auVar84,auVar84);
                auVar70 = packssdw(auVar70 ^ auVar119,auVar70 ^ auVar119);
                auVar70 = packsswb(auVar70,auVar70);
                if ((auVar70._12_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffffc) = cVar9;
                }
                auVar48 = (auVar48 | _DAT_001154a0) ^ auVar112;
                auVar104._0_4_ = -(uint)(iVar12 < auVar48._0_4_);
                auVar104._4_4_ = -(uint)(iVar13 < auVar48._4_4_);
                auVar104._8_4_ = -(uint)(iVar26 < auVar48._8_4_);
                auVar104._12_4_ = -(uint)(iVar23 < auVar48._12_4_);
                auVar85._4_4_ = auVar104._0_4_;
                auVar85._0_4_ = auVar104._0_4_;
                auVar85._8_4_ = auVar104._8_4_;
                auVar85._12_4_ = auVar104._8_4_;
                auVar42._4_4_ = -(uint)(auVar48._4_4_ == iVar13);
                auVar42._12_4_ = -(uint)(auVar48._12_4_ == iVar23);
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar50._4_4_ = auVar104._4_4_;
                auVar50._0_4_ = auVar104._4_4_;
                auVar50._8_4_ = auVar104._12_4_;
                auVar50._12_4_ = auVar104._12_4_;
                auVar48 = packssdw(auVar104,auVar42 & auVar85 | auVar50);
                auVar48 = packssdw(auVar48 ^ auVar119,auVar48 ^ auVar119);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar34 + uVar28 * 2 + 0xfffffffffffffffe) = cVar9;
                }
                auVar117 = pshufhw(auVar85,auVar85,0x84);
                auVar48 = pshufhw(auVar42,auVar42,0x84);
                auVar70 = pshufhw(auVar50,auVar50,0x84);
                auVar48 = packssdw(auVar48 & auVar117,(auVar70 | auVar48 & auVar117) ^ auVar119);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48._14_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar34 + uVar28 * 2) = cVar9;
                }
                uVar28 = uVar28 + 0x10;
              } while ((uVar24 + 0xf & 0xfffffff0) != uVar28);
            }
            uVar31 = uVar31 + 1;
            psVar34 = (stbi__uint16 *)((long)psVar34 + 1);
            psVar33 = psVar33 + 1;
            local_8920 = (stbi__uint16 *)((long)local_8920 + 1);
            local_8918 = local_8918 + 1;
          } while (uVar31 != 4);
          goto LAB_00109563;
        }
        stbi__skip(s,bVar7 * sVar11 * 2);
        lVar27 = uVar25 - 1;
        auVar118._8_4_ = (int)lVar27;
        auVar118._0_8_ = lVar27;
        auVar118._12_4_ = (int)((ulong)lVar27 >> 0x20);
        psVar33 = local_8980 + 0x1e;
        uVar31 = 0;
        auVar112 = _DAT_001154a0;
        auVar39 = _DAT_001154b0;
        auVar119 = _DAT_001154c0;
        auVar48 = _DAT_001154d0;
        auVar70 = _DAT_001154e0;
        auVar117 = _DAT_001154f0;
        auVar74 = _DAT_00115500;
        auVar123 = _DAT_00115510;
        goto LAB_001087db;
      }
      stbi__get32le(s);
      stbi__get8(s);
      stbi__get8(s);
      stbi__get8(s);
      stbi__get8(s);
      stbi__get32le(s);
      sVar11 = stbi__get32le(s);
      if (((sVar11 < 0x39) && ((0x100010000001000U >> ((ulong)sVar11 & 0x3f) & 1) != 0)) ||
         (sVar11 == 0x6c)) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      else {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (sVar11 != 0x7c) goto LAB_0010729d;
      }
      local_88cc.all_a = 0xff;
      pvVar20 = stbi__bmp_parse_header(s,&local_88cc);
      local_88f8 = local_88cc.all_a;
      if (pvVar20 == (void *)0x0) {
        return (void *)0x0;
      }
      uVar29 = s->img_y;
      uVar16 = -uVar29;
      if (0 < (int)uVar29) {
        uVar16 = uVar29;
      }
      s->img_y = uVar16;
      if ((uVar16 < 0x1000001) && (s->img_x < 0x1000001)) {
        if (local_88cc.hsz == 0xc) {
          if (0x17 < local_88cc.bpp) goto LAB_001076e0;
          uVar16 = ((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3;
LAB_00107601:
          uVar25 = (ulong)uVar16;
          if (uVar16 == 0) goto LAB_001076e0;
          bVar4 = false;
LAB_0010762b:
          bVar35 = local_88cc.ma == 0xff000000;
          local_8958 = local_88cc.bpp;
          iVar12 = 4 - (uint)(local_88cc.ma == 0);
        }
        else {
          if (local_88cc.bpp < 0x10) {
            uVar16 = local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2;
            goto LAB_00107601;
          }
LAB_001076e0:
          iVar12 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                   s->callback_already_read;
          if (iVar12 - 0x401U < 0xfffffc00) {
            pcVar19 = "bad header";
            goto LAB_00107785;
          }
          if ((local_88cc.offset < iVar12) || (0x400 < local_88cc.offset - iVar12)) {
            pcVar19 = "bad offset";
            goto LAB_00107785;
          }
          stbi__skip(s,local_88cc.offset - iVar12);
          uVar25 = 0;
          bVar35 = true;
          bVar4 = true;
          if (local_88cc.bpp != 0x18 || local_88cc.ma != 0xff000000) goto LAB_0010762b;
          iVar12 = 3;
          local_8958 = 0x18;
          bVar4 = true;
        }
        s->img_n = iVar12;
        if (2 < req_comp) {
          iVar12 = req_comp;
        }
        sVar11 = s->img_x;
        sVar14 = s->img_y;
        iVar13 = stbi__mad3sizes_valid(iVar12,sVar11,sVar14,0);
        if (iVar13 != 0) {
          data_00 = (uchar *)stbi__malloc_mad3(iVar12,sVar11,sVar14,0);
          if (data_00 == (uchar *)0x0) goto LAB_00108cfc;
          if (local_8958 < 0x10) {
            iVar13 = (int)uVar25;
            if (bVar4 || 0x100 < iVar13) {
              free(data_00);
              pcVar19 = "invalid";
              goto LAB_00107785;
            }
            if (0 < iVar13) {
              uVar31 = 0;
              do {
                sVar6 = stbi__get8(s);
                local_88a8.pal[uVar31 - 0xd][2] = sVar6;
                sVar6 = stbi__get8(s);
                local_88a8.pal[uVar31 - 0xd][1] = sVar6;
                sVar6 = stbi__get8(s);
                local_88a8.pal[uVar31 - 0xd][0] = sVar6;
                if (local_88cc.hsz != 0xc) {
                  stbi__get8(s);
                }
                local_88a8.pal[uVar31 - 0xd][3] = 0xff;
                uVar31 = uVar31 + 1;
              } while (uVar25 != uVar31);
            }
            stbi__skip(s,(iVar13 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (local_8958 == 1) {
              sVar11 = s->img_y;
              if (0 < (int)sVar11) {
                sVar14 = s->img_x;
                iVar13 = 0;
                iVar26 = 0;
                do {
                  bVar7 = stbi__get8(s);
                  sVar11 = s->img_x;
                  if (0 < (int)sVar11) {
                    uVar16 = (uint)bVar7;
                    sVar32 = 0;
                    uVar24 = 7;
                    do {
                      uVar25 = (ulong)((uVar16 >> (uVar24 & 0x1f) & 1) != 0);
                      data_00[iVar13] = local_88a8.pal[uVar25 - 0xd][0];
                      data_00[(long)iVar13 + 1] = local_88a8.pal[uVar25 - 0xd][1];
                      data_00[(long)iVar13 + 2] = local_88a8.pal[uVar25 - 0xd][2];
                      iVar23 = iVar13 + 3;
                      if (iVar12 == 4) {
                        data_00[(long)iVar13 + 3] = 0xff;
                        iVar23 = iVar13 + 4;
                      }
                      iVar13 = iVar23;
                      sVar32 = sVar32 + 1;
                      if (sVar32 == sVar11) break;
                      if ((int)uVar24 < 1) {
                        bVar7 = stbi__get8(s);
                        uVar16 = (uint)bVar7;
                        sVar11 = s->img_x;
                        uVar24 = 7;
                      }
                      else {
                        uVar24 = uVar24 - 1;
                      }
                    } while ((int)sVar32 < (int)sVar11);
                  }
                  stbi__skip(s,-(sVar14 + 7 >> 3) & 3);
                  iVar26 = iVar26 + 1;
                  sVar11 = s->img_y;
                } while (iVar26 < (int)sVar11);
              }
            }
            else {
              if (local_8958 == 8) {
                uVar16 = s->img_x;
              }
              else {
                if (local_8958 != 4) {
                  free(data_00);
                  pcVar19 = "bad bpp";
                  goto LAB_00107785;
                }
                uVar16 = s->img_x + 1 >> 1;
              }
              sVar11 = s->img_y;
              if (0 < (int)sVar11) {
                uVar25 = 0;
                iVar13 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    iVar26 = 0;
                    do {
                      bVar7 = stbi__get8(s);
                      uVar17 = bVar7 & 0xf;
                      uVar24 = (uint)(bVar7 >> 4);
                      if (local_8958 != 4) {
                        uVar24 = (uint)bVar7;
                      }
                      uVar31 = (ulong)uVar24;
                      if (local_8958 != 4) {
                        uVar17 = 0;
                      }
                      lVar27 = (long)(int)uVar25;
                      uVar28 = lVar27 + 3;
                      data_00[lVar27] = local_88a8.pal[uVar31 - 0xd][0];
                      data_00[lVar27 + 1] = local_88a8.pal[uVar31 - 0xd][1];
                      data_00[lVar27 + 2] = local_88a8.pal[uVar31 - 0xd][2];
                      if (iVar12 == 4) {
                        data_00[lVar27 + 3] = 0xff;
                        uVar28 = (ulong)((int)uVar25 + 4);
                      }
                      if (iVar26 + 1U == s->img_x) {
                        uVar25 = uVar28 & 0xffffffff;
                        break;
                      }
                      if (local_8958 == 8) {
                        bVar7 = stbi__get8(s);
                        uVar17 = (uint)bVar7;
                      }
                      lVar27 = (long)(int)uVar28;
                      uVar25 = lVar27 + 3;
                      uVar31 = (ulong)uVar17;
                      data_00[lVar27] = local_88a8.pal[uVar31 - 0xd][0];
                      data_00[lVar27 + 1] = local_88a8.pal[uVar31 - 0xd][1];
                      data_00[lVar27 + 2] = local_88a8.pal[uVar31 - 0xd][2];
                      if (iVar12 == 4) {
                        data_00[lVar27 + 3] = 0xff;
                        uVar25 = (ulong)((int)uVar28 + 4);
                      }
                      iVar26 = iVar26 + 2;
                    } while (iVar26 < (int)s->img_x);
                  }
                  stbi__skip(s,-uVar16 & 3);
                  iVar13 = iVar13 + 1;
                  sVar11 = s->img_y;
                } while (iVar13 < (int)sVar11);
              }
            }
          }
          else {
            stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
            if (local_8958 == 0x10) {
              local_892c = s->img_x * 2 & 2;
LAB_00107d0f:
              if ((local_88cc.mg != 0 && local_88cc.mr != 0) && local_88cc.mb != 0) {
                iVar15 = stbi__high_bit(local_88cc.mr);
                uVar16 = stbi__bitcount(local_88cc.mr);
                iVar13 = stbi__high_bit(local_88cc.mg);
                uVar24 = stbi__bitcount(local_88cc.mg);
                iVar26 = stbi__high_bit(local_88cc.mb);
                local_8944 = stbi__bitcount(local_88cc.mb);
                iVar23 = stbi__high_bit(local_88cc.ma);
                local_8908 = stbi__bitcount(local_88cc.ma);
                if ((local_8908 < 9 && local_8944 < 9) && (uVar24 < 9 && uVar16 < 9)) {
                  iVar15 = iVar15 + -7;
                  iVar13 = iVar13 + -7;
                  iVar26 = iVar26 + -7;
                  iVar23 = iVar23 + -7;
                  bVar35 = true;
                  bVar4 = false;
                  goto LAB_00107e12;
                }
              }
              free(data_00);
              pcVar19 = "bad masks";
              goto LAB_00107785;
            }
            if (local_8958 == 0x20) {
              local_892c = 0;
              if (!(bool)((local_88cc.mr == 0xff0000 &&
                          (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff)) & bVar35))
              goto LAB_00107d0f;
              bVar4 = true;
              bVar35 = false;
              iVar15 = 0;
              iVar13 = 0;
              iVar26 = 0;
              iVar23 = 0;
              uVar16 = 0;
              uVar24 = 0;
              local_8944 = 0;
              local_8908 = 0;
            }
            else {
              local_892c = 0;
              if (local_8958 != 0x18) goto LAB_00107d0f;
              local_892c = s->img_x & 3;
              bVar4 = false;
              bVar35 = false;
              iVar15 = 0;
              iVar13 = 0;
              iVar26 = 0;
              iVar23 = 0;
              uVar16 = 0;
              uVar24 = 0;
              local_8944 = 0;
              local_8908 = 0;
            }
LAB_00107e12:
            sVar11 = s->img_y;
            if (0 < (int)sVar11) {
              iVar149 = 0;
              iVar145 = 0;
              do {
                if (bVar35) {
                  if (0 < (int)s->img_x) {
                    iVar30 = 0;
                    do {
                      if (local_8958 == 0x10) {
                        sVar6 = stbi__get8(s);
                        sVar8 = stbi__get8(s);
                        sVar11 = (stbi__uint32)CONCAT11(sVar8,sVar6);
                      }
                      else {
                        sVar11 = stbi__get32le(s);
                      }
                      iVar18 = stbi__shiftsigned(sVar11 & local_88cc.mr,iVar15,uVar16);
                      data_00[iVar149] = (uchar)iVar18;
                      iVar18 = stbi__shiftsigned(sVar11 & local_88cc.mg,iVar13,uVar24);
                      data_00[(long)iVar149 + 1] = (uchar)iVar18;
                      iVar18 = stbi__shiftsigned(sVar11 & local_88cc.mb,iVar26,local_8944);
                      data_00[(long)iVar149 + 2] = (uchar)iVar18;
                      if (local_88cc.ma == 0) {
                        uVar17 = 0xff;
                      }
                      else {
                        uVar17 = stbi__shiftsigned(sVar11 & local_88cc.ma,iVar23,local_8908);
                      }
                      iVar18 = iVar149 + 3;
                      if (iVar12 == 4) {
                        data_00[(long)iVar149 + 3] = (uchar)uVar17;
                        iVar18 = iVar149 + 4;
                      }
                      iVar149 = iVar18;
                      local_88f8 = local_88f8 | uVar17;
                      iVar30 = iVar30 + 1;
                    } while (iVar30 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar30 = 0;
                  do {
                    sVar6 = stbi__get8(s);
                    data_00[(long)iVar149 + 2] = sVar6;
                    sVar6 = stbi__get8(s);
                    data_00[(long)iVar149 + 1] = sVar6;
                    sVar6 = stbi__get8(s);
                    data_00[iVar149] = sVar6;
                    bVar7 = 0xff;
                    if (bVar4) {
                      bVar7 = stbi__get8(s);
                    }
                    iVar18 = iVar149 + 3;
                    if (iVar12 == 4) {
                      data_00[(long)iVar149 + 3] = bVar7;
                      iVar18 = iVar149 + 4;
                    }
                    iVar149 = iVar18;
                    local_88f8 = local_88f8 | bVar7;
                    iVar30 = iVar30 + 1;
                  } while (iVar30 < (int)s->img_x);
                }
                stbi__skip(s,local_892c);
                iVar145 = iVar145 + 1;
                sVar11 = s->img_y;
              } while (iVar145 < (int)sVar11);
            }
          }
          auVar74 = _DAT_00115520;
          auVar117 = _DAT_00115510;
          auVar70 = _DAT_00115500;
          auVar48 = _DAT_001154f0;
          auVar119 = _DAT_001154e0;
          auVar39 = _DAT_001154d0;
          auVar112 = _DAT_001154c0;
          if (((iVar12 == 4) && (local_88f8 == 0)) &&
             (uVar16 = s->img_x * sVar11 * 4 - 1, -1 < (int)uVar16)) {
            uVar24 = uVar16 >> 2;
            auVar36._4_4_ = 0;
            auVar36._0_4_ = uVar24;
            auVar36._8_4_ = uVar24;
            auVar36._12_4_ = 0;
            puVar22 = data_00 + uVar16;
            uVar25 = 0;
            auVar120._8_4_ = 0xffffffff;
            auVar120._0_8_ = 0xffffffffffffffff;
            auVar120._12_4_ = 0xffffffff;
            do {
              auVar121._8_4_ = (int)uVar25;
              auVar121._0_8_ = uVar25;
              auVar121._12_4_ = (int)(uVar25 >> 0x20);
              auVar123 = auVar36 | auVar74;
              auVar125 = (auVar121 | auVar117) ^ auVar74;
              iVar13 = auVar123._0_4_;
              iVar145 = -(uint)(iVar13 < auVar125._0_4_);
              iVar26 = auVar123._4_4_;
              auVar127._4_4_ = -(uint)(iVar26 < auVar125._4_4_);
              iVar23 = auVar123._8_4_;
              iVar149 = -(uint)(iVar23 < auVar125._8_4_);
              iVar15 = auVar123._12_4_;
              auVar127._12_4_ = -(uint)(iVar15 < auVar125._12_4_);
              auVar138._4_4_ = iVar145;
              auVar138._0_4_ = iVar145;
              auVar138._8_4_ = iVar149;
              auVar138._12_4_ = iVar149;
              auVar123 = pshuflw(in_XMM1,auVar138,0xe8);
              auVar126._4_4_ = -(uint)(auVar125._4_4_ == iVar26);
              auVar126._12_4_ = -(uint)(auVar125._12_4_ == iVar15);
              auVar126._0_4_ = auVar126._4_4_;
              auVar126._8_4_ = auVar126._12_4_;
              auVar51 = pshuflw(in_XMM2,auVar126,0xe8);
              auVar127._0_4_ = auVar127._4_4_;
              auVar127._8_4_ = auVar127._12_4_;
              auVar125 = pshuflw(auVar123,auVar127,0xe8);
              auVar123 = (auVar125 | auVar51 & auVar123) ^ auVar120;
              auVar123 = packssdw(auVar123,auVar123);
              if ((auVar123 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar22 = 0xff;
              }
              auVar127 = auVar126 & auVar138 | auVar127;
              auVar123 = packssdw(auVar127,auVar127);
              auVar123 = packssdw(auVar123 ^ auVar120,auVar123 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._0_4_ >> 8 & 1) != 0) {
                puVar22[-4] = 0xff;
              }
              auVar123 = (auVar121 | auVar70) ^ auVar74;
              auVar52._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar52._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar52._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar52._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar128._4_4_ = auVar52._0_4_;
              auVar128._0_4_ = auVar52._0_4_;
              auVar128._8_4_ = auVar52._8_4_;
              auVar128._12_4_ = auVar52._8_4_;
              iVar145 = -(uint)(auVar123._4_4_ == iVar26);
              iVar149 = -(uint)(auVar123._12_4_ == iVar15);
              auVar139._4_4_ = iVar145;
              auVar139._0_4_ = iVar145;
              auVar139._8_4_ = iVar149;
              auVar139._12_4_ = iVar149;
              auVar146._4_4_ = auVar52._4_4_;
              auVar146._0_4_ = auVar52._4_4_;
              auVar146._8_4_ = auVar52._12_4_;
              auVar146._12_4_ = auVar52._12_4_;
              auVar123 = auVar139 & auVar128 | auVar146;
              auVar123 = packssdw(auVar123,auVar123);
              auVar123 = packssdw(auVar123 ^ auVar120,auVar123 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._0_4_ >> 0x10 & 1) != 0) {
                puVar22[-8] = 0xff;
              }
              auVar123 = pshufhw(auVar123,auVar128,0x84);
              auVar51 = pshufhw(auVar52,auVar139,0x84);
              auVar125 = pshufhw(auVar123,auVar146,0x84);
              auVar123 = (auVar125 | auVar51 & auVar123) ^ auVar120;
              auVar123 = packssdw(auVar123,auVar123);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._0_4_ >> 0x18 & 1) != 0) {
                puVar22[-0xc] = 0xff;
              }
              auVar123 = (auVar121 | auVar48) ^ auVar74;
              auVar53._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar53._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar53._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar53._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar140._4_4_ = auVar53._0_4_;
              auVar140._0_4_ = auVar53._0_4_;
              auVar140._8_4_ = auVar53._8_4_;
              auVar140._12_4_ = auVar53._8_4_;
              auVar51 = pshuflw(auVar146,auVar140,0xe8);
              auVar43._0_4_ = -(uint)(auVar123._0_4_ == iVar13);
              auVar43._4_4_ = -(uint)(auVar123._4_4_ == iVar26);
              auVar43._8_4_ = -(uint)(auVar123._8_4_ == iVar23);
              auVar43._12_4_ = -(uint)(auVar123._12_4_ == iVar15);
              auVar129._4_4_ = auVar43._4_4_;
              auVar129._0_4_ = auVar43._4_4_;
              auVar129._8_4_ = auVar43._12_4_;
              auVar129._12_4_ = auVar43._12_4_;
              auVar123 = pshuflw(auVar43,auVar129,0xe8);
              auVar130._4_4_ = auVar53._4_4_;
              auVar130._0_4_ = auVar53._4_4_;
              auVar130._8_4_ = auVar53._12_4_;
              auVar130._12_4_ = auVar53._12_4_;
              auVar125 = pshuflw(auVar53,auVar130,0xe8);
              auVar123 = packssdw(auVar123 & auVar51,(auVar125 | auVar123 & auVar51) ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar22[-0x10] = 0xff;
              }
              auVar130 = auVar129 & auVar140 | auVar130;
              auVar125 = packssdw(auVar130,auVar130);
              auVar123 = packssdw(auVar123,auVar125 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._4_2_ >> 8 & 1) != 0) {
                puVar22[-0x14] = 0xff;
              }
              auVar123 = (auVar121 | auVar119) ^ auVar74;
              auVar54._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar54._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar54._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar54._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar131._4_4_ = auVar54._0_4_;
              auVar131._0_4_ = auVar54._0_4_;
              auVar131._8_4_ = auVar54._8_4_;
              auVar131._12_4_ = auVar54._8_4_;
              iVar145 = -(uint)(auVar123._4_4_ == iVar26);
              iVar149 = -(uint)(auVar123._12_4_ == iVar15);
              auVar141._4_4_ = iVar145;
              auVar141._0_4_ = iVar145;
              auVar141._8_4_ = iVar149;
              auVar141._12_4_ = iVar149;
              auVar147._4_4_ = auVar54._4_4_;
              auVar147._0_4_ = auVar54._4_4_;
              auVar147._8_4_ = auVar54._12_4_;
              auVar147._12_4_ = auVar54._12_4_;
              auVar123 = auVar141 & auVar131 | auVar147;
              auVar123 = packssdw(auVar123,auVar123);
              auVar123 = packssdw(auVar123 ^ auVar120,auVar123 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar22[-0x18] = 0xff;
              }
              auVar123 = pshufhw(auVar123,auVar131,0x84);
              auVar51 = pshufhw(auVar54,auVar141,0x84);
              auVar125 = pshufhw(auVar123,auVar147,0x84);
              auVar123 = (auVar125 | auVar51 & auVar123) ^ auVar120;
              auVar123 = packssdw(auVar123,auVar123);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._6_2_ >> 8 & 1) != 0) {
                puVar22[-0x1c] = 0xff;
              }
              auVar123 = (auVar121 | auVar39) ^ auVar74;
              auVar55._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar55._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar55._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar55._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar142._4_4_ = auVar55._0_4_;
              auVar142._0_4_ = auVar55._0_4_;
              auVar142._8_4_ = auVar55._8_4_;
              auVar142._12_4_ = auVar55._8_4_;
              auVar51 = pshuflw(auVar147,auVar142,0xe8);
              auVar44._0_4_ = -(uint)(auVar123._0_4_ == iVar13);
              auVar44._4_4_ = -(uint)(auVar123._4_4_ == iVar26);
              auVar44._8_4_ = -(uint)(auVar123._8_4_ == iVar23);
              auVar44._12_4_ = -(uint)(auVar123._12_4_ == iVar15);
              auVar132._4_4_ = auVar44._4_4_;
              auVar132._0_4_ = auVar44._4_4_;
              auVar132._8_4_ = auVar44._12_4_;
              auVar132._12_4_ = auVar44._12_4_;
              auVar123 = pshuflw(auVar44,auVar132,0xe8);
              auVar133._4_4_ = auVar55._4_4_;
              auVar133._0_4_ = auVar55._4_4_;
              auVar133._8_4_ = auVar55._12_4_;
              auVar133._12_4_ = auVar55._12_4_;
              auVar125 = pshuflw(auVar55,auVar133,0xe8);
              auVar125 = (auVar125 | auVar123 & auVar51) ^ auVar120;
              auVar125 = packssdw(auVar125,auVar125);
              auVar123 = packsswb(auVar123 & auVar51,auVar125);
              if ((auVar123 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar22[-0x20] = 0xff;
              }
              auVar133 = auVar132 & auVar142 | auVar133;
              auVar125 = packssdw(auVar133,auVar133);
              auVar125 = packssdw(auVar125 ^ auVar120,auVar125 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar125);
              if ((auVar123._8_2_ >> 8 & 1) != 0) {
                puVar22[-0x24] = 0xff;
              }
              auVar123 = (auVar121 | auVar112) ^ auVar74;
              auVar56._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar56._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar56._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar56._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar134._4_4_ = auVar56._0_4_;
              auVar134._0_4_ = auVar56._0_4_;
              auVar134._8_4_ = auVar56._8_4_;
              auVar134._12_4_ = auVar56._8_4_;
              iVar145 = -(uint)(auVar123._4_4_ == iVar26);
              iVar149 = -(uint)(auVar123._12_4_ == iVar15);
              auVar143._4_4_ = iVar145;
              auVar143._0_4_ = iVar145;
              auVar143._8_4_ = iVar149;
              auVar143._12_4_ = iVar149;
              auVar148._4_4_ = auVar56._4_4_;
              auVar148._0_4_ = auVar56._4_4_;
              auVar148._8_4_ = auVar56._12_4_;
              auVar148._12_4_ = auVar56._12_4_;
              auVar123 = auVar143 & auVar134 | auVar148;
              auVar123 = packssdw(auVar123,auVar123);
              auVar123 = packssdw(auVar123 ^ auVar120,auVar123 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar22[-0x28] = 0xff;
              }
              auVar123 = pshufhw(auVar123,auVar134,0x84);
              auVar51 = pshufhw(auVar56,auVar143,0x84);
              auVar125 = pshufhw(auVar123,auVar148,0x84);
              auVar123 = (auVar125 | auVar51 & auVar123) ^ auVar120;
              auVar123 = packssdw(auVar123,auVar123);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._10_2_ >> 8 & 1) != 0) {
                puVar22[-0x2c] = 0xff;
              }
              auVar123 = (auVar121 | _DAT_001154b0) ^ auVar74;
              auVar57._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar57._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar57._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar57._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar144._4_4_ = auVar57._0_4_;
              auVar144._0_4_ = auVar57._0_4_;
              auVar144._8_4_ = auVar57._8_4_;
              auVar144._12_4_ = auVar57._8_4_;
              auVar51 = pshuflw(auVar148,auVar144,0xe8);
              auVar45._0_4_ = -(uint)(auVar123._0_4_ == iVar13);
              auVar45._4_4_ = -(uint)(auVar123._4_4_ == iVar26);
              auVar45._8_4_ = -(uint)(auVar123._8_4_ == iVar23);
              auVar45._12_4_ = -(uint)(auVar123._12_4_ == iVar15);
              auVar135._4_4_ = auVar45._4_4_;
              auVar135._0_4_ = auVar45._4_4_;
              auVar135._8_4_ = auVar45._12_4_;
              auVar135._12_4_ = auVar45._12_4_;
              auVar123 = pshuflw(auVar45,auVar135,0xe8);
              auVar136._4_4_ = auVar57._4_4_;
              auVar136._0_4_ = auVar57._4_4_;
              auVar136._8_4_ = auVar57._12_4_;
              auVar136._12_4_ = auVar57._12_4_;
              auVar125 = pshuflw(auVar57,auVar136,0xe8);
              auVar123 = packssdw(auVar123 & auVar51,(auVar125 | auVar123 & auVar51) ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar22[-0x30] = 0xff;
              }
              auVar136 = auVar135 & auVar144 | auVar136;
              auVar125 = packssdw(auVar136,auVar136);
              auVar123 = packssdw(auVar123,auVar125 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123._12_2_ >> 8 & 1) != 0) {
                puVar22[-0x34] = 0xff;
              }
              auVar123 = (auVar121 | _DAT_001154a0) ^ auVar74;
              auVar46._0_4_ = -(uint)(iVar13 < auVar123._0_4_);
              auVar46._4_4_ = -(uint)(iVar26 < auVar123._4_4_);
              auVar46._8_4_ = -(uint)(iVar23 < auVar123._8_4_);
              auVar46._12_4_ = -(uint)(iVar15 < auVar123._12_4_);
              auVar137._4_4_ = auVar46._0_4_;
              auVar137._0_4_ = auVar46._0_4_;
              auVar137._8_4_ = auVar46._8_4_;
              auVar137._12_4_ = auVar46._8_4_;
              auVar122._4_4_ = -(uint)(auVar123._4_4_ == iVar26);
              auVar122._12_4_ = -(uint)(auVar123._12_4_ == iVar15);
              auVar122._0_4_ = auVar122._4_4_;
              auVar122._8_4_ = auVar122._12_4_;
              auVar124._4_4_ = auVar46._4_4_;
              auVar124._0_4_ = auVar46._4_4_;
              auVar124._8_4_ = auVar46._12_4_;
              auVar124._12_4_ = auVar46._12_4_;
              auVar125 = auVar122 & auVar137 | auVar124;
              auVar123 = packssdw(auVar46,auVar125);
              auVar123 = packssdw(auVar123 ^ auVar120,auVar123 ^ auVar120);
              auVar123 = packsswb(auVar123,auVar123);
              if ((auVar123 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar22[-0x38] = 0xff;
              }
              auVar123 = pshufhw(auVar123,auVar137,0x84);
              in_XMM2 = pshufhw(auVar125,auVar122,0x84);
              in_XMM2 = in_XMM2 & auVar123;
              auVar123 = pshufhw(auVar123,auVar124,0x84);
              auVar123 = (auVar123 | in_XMM2) ^ auVar120;
              auVar123 = packssdw(auVar123,auVar123);
              in_XMM1 = packsswb(auVar123,auVar123);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar22[-0x3c] = 0xff;
              }
              uVar25 = uVar25 + 0x10;
              puVar22 = puVar22 + -0x40;
            } while ((uVar24 + 0x10 & 0x3ffffff0) != uVar25);
          }
          if ((int)uVar29 < 1) {
            uVar29 = s->img_x;
          }
          else {
            uVar29 = s->img_x;
            if (0 < (int)sVar11 >> 1) {
              uVar16 = uVar29 * iVar12;
              uVar24 = (sVar11 - 1) * uVar16;
              uVar25 = 0;
              uVar31 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar28 = 0;
                  do {
                    uVar1 = data_00[uVar28 + uVar25];
                    data_00[uVar28 + uVar25] = data_00[uVar28 + uVar24];
                    data_00[uVar28 + uVar24] = uVar1;
                    uVar28 = uVar28 + 1;
                  } while (uVar16 != uVar28);
                }
                uVar31 = uVar31 + 1;
                uVar24 = uVar24 - uVar16;
                uVar25 = (ulong)((int)uVar25 + uVar16);
              } while (uVar31 != (uint)((int)sVar11 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar12 != req_comp)) {
            data_00 = stbi__convert_format(data_00,iVar12,req_comp,uVar29,sVar11);
            if (data_00 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar29 = s->img_x;
          }
          *x = uVar29;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return data_00;
          }
          return data_00;
        }
      }
LAB_0010777e:
      pcVar19 = "too large";
      goto LAB_00107785;
    }
    lVar27 = lVar27 + 1;
  } while (lVar27 != 8);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (4 < (uint)req_comp) {
    pcVar19 = "bad req_comp";
LAB_00107785:
    *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
    return (void *)0x0;
  }
  local_88a8._0_8_ = s;
  iVar12 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
  uVar5 = local_88a8._0_8_;
  if (iVar12 == 0) {
    data = (stbi__context *)0x0;
  }
  else {
    iVar12 = 8;
    if ((8 < local_88a8.flags) && (iVar12 = 0x10, local_88a8.flags != 0x10)) {
      pcVar19 = "bad bits_per_channel";
      goto LAB_00107785;
    }
    ri->bits_per_channel = iVar12;
    data = (stbi__context *)local_88a8.history;
    if ((req_comp != 0) && (iVar12 = *(int *)(local_88a8._0_8_ + 0xc), iVar12 != req_comp)) {
      if (local_88a8.flags < 9) {
        data = (stbi__context *)
               stbi__convert_format
                         (local_88a8.history,iVar12,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                          *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        data = (stbi__context *)
               stbi__convert_format16
                         ((stbi__uint16 *)local_88a8.history,iVar12,req_comp,
                          *(stbi__uint32 *)local_88a8._0_8_,*(stbi__uint32 *)(local_88a8._0_8_ + 4))
        ;
      }
      *(int *)(uVar5 + 0xc) = req_comp;
      if (data == (stbi__context *)0x0) {
        return (void *)0x0;
      }
    }
    *x = *(stbi__uint32 *)uVar5;
    *y = *(stbi__uint32 *)(uVar5 + 4);
    if (comp != (int *)0x0) {
      *comp = *(int *)(uVar5 + 8);
    }
    local_88a8.history = (stbi_uc *)0x0;
  }
  free(local_88a8.history);
  free(local_88a8.background);
LAB_00107595:
  free(local_88a8.out);
  return data;
LAB_001087db:
  if (uVar31 < uVar29) {
    iVar12 = stbi__psd_decode_rle(s,(stbi_uc *)((long)local_8980 + uVar31),uVar24);
    auVar112 = _DAT_001154a0;
    auVar39 = _DAT_001154b0;
    auVar119 = _DAT_001154c0;
    auVar48 = _DAT_001154d0;
    auVar70 = _DAT_001154e0;
    auVar117 = _DAT_001154f0;
    auVar74 = _DAT_00115500;
    auVar123 = _DAT_00115510;
    if (iVar12 == 0) {
      free(local_8980);
      pcVar19 = "corrupt";
      goto LAB_00107785;
    }
  }
  else if (0 < (int)uVar24) {
    cVar9 = -(uVar31 == 3);
    uVar28 = 0;
    do {
      auVar37._8_4_ = (int)uVar28;
      auVar37._0_8_ = uVar28;
      auVar37._12_4_ = (int)(uVar28 >> 0x20);
      auVar125 = auVar118 ^ _DAT_00115520;
      auVar51 = (auVar37 | auVar123) ^ _DAT_00115520;
      iVar12 = auVar125._0_4_;
      iVar15 = -(uint)(iVar12 < auVar51._0_4_);
      iVar13 = auVar125._4_4_;
      auVar59._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
      iVar26 = auVar125._8_4_;
      iVar145 = -(uint)(iVar26 < auVar51._8_4_);
      iVar23 = auVar125._12_4_;
      auVar59._12_4_ = -(uint)(iVar23 < auVar51._12_4_);
      auVar87._4_4_ = iVar15;
      auVar87._0_4_ = iVar15;
      auVar87._8_4_ = iVar145;
      auVar87._12_4_ = iVar145;
      auVar125 = pshuflw(in_XMM5,auVar87,0xe8);
      auVar58._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
      auVar58._12_4_ = -(uint)(auVar51._12_4_ == iVar23);
      auVar58._0_4_ = auVar58._4_4_;
      auVar58._8_4_ = auVar58._12_4_;
      auVar113 = pshuflw(in_XMM6,auVar58,0xe8);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar51 = pshuflw(auVar125,auVar59,0xe8);
      auVar114._8_4_ = 0xffffffff;
      auVar114._0_8_ = 0xffffffffffffffff;
      auVar114._12_4_ = 0xffffffff;
      auVar125 = (auVar51 | auVar113 & auVar125) ^ auVar114;
      auVar125 = packssdw(auVar125,auVar125);
      if ((auVar125 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffe2) = cVar9;
      }
      auVar59 = auVar58 & auVar87 | auVar59;
      auVar125 = packssdw(auVar59,auVar59);
      auVar125 = packssdw(auVar125 ^ auVar114,auVar125 ^ auVar114);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125._0_4_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffe4) = cVar9;
      }
      auVar125 = (auVar37 | auVar74) ^ _DAT_00115520;
      iVar15 = -(uint)(iVar12 < auVar125._0_4_);
      auVar106._4_4_ = -(uint)(iVar13 < auVar125._4_4_);
      iVar145 = -(uint)(iVar26 < auVar125._8_4_);
      auVar106._12_4_ = -(uint)(iVar23 < auVar125._12_4_);
      auVar60._4_4_ = iVar15;
      auVar60._0_4_ = iVar15;
      auVar60._8_4_ = iVar145;
      auVar60._12_4_ = iVar145;
      auVar88._4_4_ = -(uint)(auVar125._4_4_ == iVar13);
      auVar88._12_4_ = -(uint)(auVar125._12_4_ == iVar23);
      auVar88._0_4_ = auVar88._4_4_;
      auVar88._8_4_ = auVar88._12_4_;
      auVar106._0_4_ = auVar106._4_4_;
      auVar106._8_4_ = auVar106._12_4_;
      auVar125 = auVar88 & auVar60 | auVar106;
      auVar125 = packssdw(auVar125,auVar125);
      auVar125 = packssdw(auVar125 ^ auVar114,auVar125 ^ auVar114);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125._0_4_ >> 0x10 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffe6) = cVar9;
      }
      auVar51 = pshufhw(auVar60,auVar60,0x84);
      auVar89 = pshufhw(auVar88,auVar88,0x84);
      auVar113 = pshufhw(auVar51,auVar106,0x84);
      auVar51 = (auVar113 | auVar89 & auVar51) ^ auVar114;
      auVar51 = packssdw(auVar51,auVar51);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._0_4_ >> 0x18 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffe8) = cVar9;
      }
      auVar51 = (auVar37 | auVar117) ^ _DAT_00115520;
      iVar15 = -(uint)(iVar12 < auVar51._0_4_);
      auVar62._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
      iVar145 = -(uint)(iVar26 < auVar51._8_4_);
      auVar62._12_4_ = -(uint)(iVar23 < auVar51._12_4_);
      auVar90._4_4_ = iVar15;
      auVar90._0_4_ = iVar15;
      auVar90._8_4_ = iVar145;
      auVar90._12_4_ = iVar145;
      auVar125 = pshuflw(auVar125,auVar90,0xe8);
      auVar61._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
      auVar61._12_4_ = -(uint)(auVar51._12_4_ == iVar23);
      auVar61._0_4_ = auVar61._4_4_;
      auVar61._8_4_ = auVar61._12_4_;
      auVar113 = pshuflw(auVar114,auVar61,0xe8);
      auVar62._0_4_ = auVar62._4_4_;
      auVar62._8_4_ = auVar62._12_4_;
      auVar51 = pshuflw(auVar125,auVar62,0xe8);
      auVar115._8_4_ = 0xffffffff;
      auVar115._0_8_ = 0xffffffffffffffff;
      auVar115._12_4_ = 0xffffffff;
      auVar125 = (auVar51 | auVar113 & auVar125) ^ auVar115;
      auVar125 = packssdw(auVar125,auVar125);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffea) = cVar9;
      }
      auVar62 = auVar61 & auVar90 | auVar62;
      auVar125 = packssdw(auVar62,auVar62);
      auVar125 = packssdw(auVar125 ^ auVar115,auVar125 ^ auVar115);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125._4_2_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffec) = cVar9;
      }
      auVar125 = (auVar37 | auVar70) ^ _DAT_00115520;
      iVar15 = -(uint)(iVar12 < auVar125._0_4_);
      auVar107._4_4_ = -(uint)(iVar13 < auVar125._4_4_);
      iVar145 = -(uint)(iVar26 < auVar125._8_4_);
      auVar107._12_4_ = -(uint)(iVar23 < auVar125._12_4_);
      auVar63._4_4_ = iVar15;
      auVar63._0_4_ = iVar15;
      auVar63._8_4_ = iVar145;
      auVar63._12_4_ = iVar145;
      auVar91._4_4_ = -(uint)(auVar125._4_4_ == iVar13);
      auVar91._12_4_ = -(uint)(auVar125._12_4_ == iVar23);
      auVar91._0_4_ = auVar91._4_4_;
      auVar91._8_4_ = auVar91._12_4_;
      auVar107._0_4_ = auVar107._4_4_;
      auVar107._8_4_ = auVar107._12_4_;
      auVar125 = auVar91 & auVar63 | auVar107;
      auVar125 = packssdw(auVar125,auVar125);
      auVar125 = packssdw(auVar125 ^ auVar115,auVar125 ^ auVar115);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xffffffffffffffee) = cVar9;
      }
      auVar51 = pshufhw(auVar63,auVar63,0x84);
      auVar89 = pshufhw(auVar91,auVar91,0x84);
      auVar113 = pshufhw(auVar51,auVar107,0x84);
      auVar51 = (auVar113 | auVar89 & auVar51) ^ auVar115;
      auVar51 = packssdw(auVar51,auVar51);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._6_2_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffff0) = cVar9;
      }
      auVar51 = (auVar37 | auVar48) ^ _DAT_00115520;
      iVar15 = -(uint)(iVar12 < auVar51._0_4_);
      auVar65._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
      iVar145 = -(uint)(iVar26 < auVar51._8_4_);
      auVar65._12_4_ = -(uint)(iVar23 < auVar51._12_4_);
      auVar92._4_4_ = iVar15;
      auVar92._0_4_ = iVar15;
      auVar92._8_4_ = iVar145;
      auVar92._12_4_ = iVar145;
      auVar125 = pshuflw(auVar125,auVar92,0xe8);
      auVar64._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
      auVar64._12_4_ = -(uint)(auVar51._12_4_ == iVar23);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar113 = pshuflw(auVar115,auVar64,0xe8);
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar51 = pshuflw(auVar125,auVar65,0xe8);
      auVar116._8_4_ = 0xffffffff;
      auVar116._0_8_ = 0xffffffffffffffff;
      auVar116._12_4_ = 0xffffffff;
      auVar125 = (auVar51 | auVar113 & auVar125) ^ auVar116;
      auVar125 = packssdw(auVar125,auVar125);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffff2) = cVar9;
      }
      auVar65 = auVar64 & auVar92 | auVar65;
      auVar125 = packssdw(auVar65,auVar65);
      auVar125 = packssdw(auVar125 ^ auVar116,auVar125 ^ auVar116);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125._8_2_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffff4) = cVar9;
      }
      auVar125 = (auVar37 | auVar119) ^ _DAT_00115520;
      iVar15 = -(uint)(iVar12 < auVar125._0_4_);
      auVar108._4_4_ = -(uint)(iVar13 < auVar125._4_4_);
      iVar145 = -(uint)(iVar26 < auVar125._8_4_);
      auVar108._12_4_ = -(uint)(iVar23 < auVar125._12_4_);
      auVar66._4_4_ = iVar15;
      auVar66._0_4_ = iVar15;
      auVar66._8_4_ = iVar145;
      auVar66._12_4_ = iVar145;
      auVar93._4_4_ = -(uint)(auVar125._4_4_ == iVar13);
      auVar93._12_4_ = -(uint)(auVar125._12_4_ == iVar23);
      auVar93._0_4_ = auVar93._4_4_;
      auVar93._8_4_ = auVar93._12_4_;
      auVar108._0_4_ = auVar108._4_4_;
      auVar108._8_4_ = auVar108._12_4_;
      auVar125 = auVar93 & auVar66 | auVar108;
      auVar125 = packssdw(auVar125,auVar125);
      auVar125 = packssdw(auVar125 ^ auVar116,auVar125 ^ auVar116);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffff6) = cVar9;
      }
      auVar51 = pshufhw(auVar66,auVar66,0x84);
      auVar89 = pshufhw(auVar93,auVar93,0x84);
      auVar113 = pshufhw(auVar51,auVar108,0x84);
      auVar51 = (auVar113 | auVar89 & auVar51) ^ auVar116;
      auVar51 = packssdw(auVar51,auVar51);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._10_2_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffff8) = cVar9;
      }
      auVar51 = (auVar37 | auVar39) ^ _DAT_00115520;
      iVar15 = -(uint)(iVar12 < auVar51._0_4_);
      auVar68._4_4_ = -(uint)(iVar13 < auVar51._4_4_);
      iVar145 = -(uint)(iVar26 < auVar51._8_4_);
      auVar68._12_4_ = -(uint)(iVar23 < auVar51._12_4_);
      auVar94._4_4_ = iVar15;
      auVar94._0_4_ = iVar15;
      auVar94._8_4_ = iVar145;
      auVar94._12_4_ = iVar145;
      auVar125 = pshuflw(auVar125,auVar94,0xe8);
      auVar67._4_4_ = -(uint)(auVar51._4_4_ == iVar13);
      auVar67._12_4_ = -(uint)(auVar51._12_4_ == iVar23);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar113 = pshuflw(auVar116,auVar67,0xe8);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar51 = pshuflw(auVar125,auVar68,0xe8);
      in_XMM6._8_4_ = 0xffffffff;
      in_XMM6._0_8_ = 0xffffffffffffffff;
      in_XMM6._12_4_ = 0xffffffff;
      auVar125 = (auVar51 | auVar113 & auVar125) ^ in_XMM6;
      auVar125 = packssdw(auVar125,auVar125);
      in_XMM5 = packsswb(auVar125,auVar125);
      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffffa) = cVar9;
      }
      auVar68 = auVar67 & auVar94 | auVar68;
      auVar125 = packssdw(auVar68,auVar68);
      auVar125 = packssdw(auVar125 ^ in_XMM6,auVar125 ^ in_XMM6);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125._12_2_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffffc) = cVar9;
      }
      auVar125 = (auVar37 | auVar112) ^ _DAT_00115520;
      auVar95._0_4_ = -(uint)(iVar12 < auVar125._0_4_);
      auVar95._4_4_ = -(uint)(iVar13 < auVar125._4_4_);
      auVar95._8_4_ = -(uint)(iVar26 < auVar125._8_4_);
      auVar95._12_4_ = -(uint)(iVar23 < auVar125._12_4_);
      auVar69._4_4_ = auVar95._0_4_;
      auVar69._0_4_ = auVar95._0_4_;
      auVar69._8_4_ = auVar95._8_4_;
      auVar69._12_4_ = auVar95._8_4_;
      auVar38._4_4_ = -(uint)(auVar125._4_4_ == iVar13);
      auVar38._12_4_ = -(uint)(auVar125._12_4_ == iVar23);
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar47._4_4_ = auVar95._4_4_;
      auVar47._0_4_ = auVar95._4_4_;
      auVar47._8_4_ = auVar95._12_4_;
      auVar47._12_4_ = auVar95._12_4_;
      auVar125 = packssdw(auVar95,auVar38 & auVar69 | auVar47);
      auVar125 = packssdw(auVar125 ^ in_XMM6,auVar125 ^ in_XMM6);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)(psVar33 + uVar28 * 2 + 0xfffffffffffffffe) = cVar9;
      }
      auVar113 = pshufhw(auVar69,auVar69,0x84);
      auVar125 = pshufhw(auVar38,auVar38,0x84);
      auVar51 = pshufhw(auVar47,auVar47,0x84);
      auVar125 = packssdw(auVar125 & auVar113,(auVar51 | auVar125 & auVar113) ^ in_XMM6);
      auVar125 = packsswb(auVar125,auVar125);
      if ((auVar125._14_2_ >> 8 & 1) != 0) {
        *(char *)(psVar33 + uVar28 * 2) = cVar9;
      }
      uVar28 = uVar28 + 0x10;
    } while ((uVar24 + 0xf & 0xfffffff0) != uVar28);
  }
  uVar31 = uVar31 + 1;
  psVar33 = (stbi__uint16 *)((long)psVar33 + 1);
  if (uVar31 == 4) {
LAB_00109563:
    if (3 < uVar29) {
      if (ri->bits_per_channel == 0x10) {
        if (0 < (int)uVar24) {
          uVar31 = 0;
          do {
            uVar2 = local_8980[uVar31 * 4 + 3];
            if ((uVar2 != 0) && (uVar2 != 0xffff)) {
              fVar105 = 1.0 / ((float)uVar2 / 65535.0);
              fVar86 = (1.0 - fVar105) * 65535.0;
              auVar112._0_4_ =
                   (int)(fVar86 + fVar105 * (float)(*(uint *)(local_8980 + uVar31 * 4) & 0xffff));
              auVar112._4_4_ =
                   (int)(fVar86 + fVar105 * (float)(*(uint *)(local_8980 + uVar31 * 4) >> 0x10));
              auVar112._8_4_ = (int)(fVar86 + fVar105 * 0.0);
              auVar112._12_4_ = (int)(fVar86 + fVar105 * 0.0);
              auVar112 = pshuflw(auVar112,auVar112,0xe8);
              *(int *)(local_8980 + uVar31 * 4) = auVar112._0_4_;
              local_8980[uVar31 * 4 + 2] =
                   (stbi__uint16)(int)((float)local_8980[uVar31 * 4 + 2] * fVar105 + fVar86);
            }
            uVar31 = uVar31 + 1;
          } while (uVar25 != uVar31);
        }
      }
      else if (0 < (int)uVar24) {
        uVar31 = 0;
        do {
          bVar7 = *(byte *)((long)local_8980 + uVar31 * 4 + 3);
          if ((bVar7 != 0) && (bVar7 != 0xff)) {
            fVar105 = 1.0 / ((float)bVar7 / 255.0);
            fVar86 = (1.0 - fVar105) * 255.0;
            *(char *)(local_8980 + uVar31 * 2) =
                 (char)(int)((float)(byte)local_8980[uVar31 * 2] * fVar105 + fVar86);
            *(char *)((long)local_8980 + uVar31 * 4 + 1) =
                 (char)(int)((float)*(byte *)((long)local_8980 + uVar31 * 4 + 1) * fVar105 + fVar86)
            ;
            *(char *)(local_8980 + uVar31 * 2 + 1) =
                 (char)(int)((float)(byte)local_8980[uVar31 * 2 + 1] * fVar105 + fVar86);
          }
          uVar31 = uVar31 + 1;
        } while (uVar25 != uVar31);
      }
    }
    if ((req_comp & 0xfffffffbU) != 0) {
      if (ri->bits_per_channel == 0x10) {
        local_8980 = stbi__convert_format16(local_8980,4,req_comp,sVar14,sVar11);
      }
      else {
        local_8980 = (stbi__uint16 *)
                     stbi__convert_format((uchar *)local_8980,4,req_comp,sVar14,sVar11);
      }
      if (local_8980 == (stbi__uint16 *)0x0) {
        return (void *)0x0;
      }
    }
    if (comp != (int *)0x0) {
      *comp = 4;
    }
    *y = sVar11;
    *x = sVar14;
    return local_8980;
  }
  goto LAB_001087db;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}